

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void prf_model_destroy(prf_model_t *model)

{
  long *in_RDI;
  prf_cb_t traverseCB;
  prf_model_t *in_stack_00000050;
  undefined1 in_stack_00000058 [16];
  code *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  pool_t pool_id;
  long *plVar1;
  
  pool_id = (pool_t)((ulong)in_stack_fffffffffffffff0 >> 0x30);
  if (*in_RDI != 0) {
    in_stack_ffffffffffffffe8 = destroy_cb;
    plVar1 = in_RDI;
    prf_model_traverse_df(in_stack_00000050,(prf_cb_t)in_stack_00000058);
    pool_id = (pool_t)((ulong)plVar1 >> 0x30);
  }
  if ((short)in_RDI[1] != 0) {
    pool_destroy(pool_id);
  }
  if (in_RDI[3] != 0) {
    prf_vertextras_exit((prf_model_t *)in_stack_ffffffffffffffe8);
  }
  free(in_RDI);
  return;
}

Assistant:

void
prf_model_destroy(
    prf_model_t * model )
{
    assert( model != NULL );

    if ( model->header != NULL ) {
        prf_cb_t traverseCB;
        prf_cb_set( traverseCB, destroy_cb, model );
        prf_model_traverse_df( model, traverseCB );
    }

    if ( model->mempool_id != 0 )
        pool_destroy( model->mempool_id );

    if ( model->vertextras != NULL )
        prf_vertextras_exit( model );

    free( model );
}